

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter
               (TPZVec<int> *firstHCurlFunc,TPZVec<int> *conOrders,TPZVec<int> *filteredFuncs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MElementType MVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  ostream *poVar8;
  TPZVec<int> *in_RDX;
  TPZVec<int> *in_RSI;
  TPZVec<int> *in_RDI;
  int ifunc_8;
  int firstyfunc;
  int ifunc_7;
  int firstxfunc;
  int ifunc_6;
  int nvkik1;
  int nvkik;
  int firstVki;
  int ifunc_5;
  int nvkf;
  int offset;
  int firstvkf;
  int nintfuncs;
  int firstSideShape_1;
  int order_1;
  int icon_1;
  int ifunc_4;
  int ifunc_3;
  int nPhiFiK1;
  int nPhiFiK;
  int firstVfiK_1;
  int ifunc_2;
  int nfuncs_1;
  int ie_1;
  int nedges_1;
  int firstVfeK_1;
  int nfacefuncs_1;
  int ifunc_1;
  int nPhiFi;
  int firstVfiK;
  int ifunc;
  int nfuncs;
  int ie;
  int nedges;
  int firstVfeK;
  int nfacefuncs;
  int order;
  int firstSideShape;
  int64_t side;
  int icon;
  int iface;
  int fcount;
  int nEdges;
  int nFaces;
  int64_t nConnects;
  int64_t nNodes;
  int64_t dim;
  size_t in_stack_00000308;
  char *in_stack_00000310;
  int local_e8;
  int local_e0;
  int local_d8;
  int local_c8;
  int local_a8;
  int local_a4;
  int local_94;
  int local_8c;
  int local_84;
  int local_7c;
  int local_70;
  int local_68;
  int local_60;
  int local_50;
  int local_40;
  int local_3c;
  
  iVar1 = pztopology::TPZCube::NumSides(0x18d5c4d);
  iVar2 = pztopology::TPZCube::NumSides(0x18d5c5e);
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,0);
  local_3c = 0;
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    iVar3 = iVar2 + local_40;
    local_50 = iVar3 + 8;
    piVar7 = TPZVec<int>::operator[](in_RDI,(long)iVar3);
    iVar5 = *piVar7;
    piVar7 = TPZVec<int>::operator[](in_RSI,(long)iVar3);
    iVar3 = *piVar7;
    MVar4 = pztopology::TPZCube::Type(local_50);
    if (MVar4 == ETriangle) {
      if (1 < iVar3) {
        iVar6 = (iVar3 + -1) * (iVar3 + 2);
        (*in_RDX->_vptr_TPZVec[3])(in_RDX,(long)(local_3c + iVar6 / 2),(long)iVar6 % 2 & 0xffffffff)
        ;
        local_60 = iVar5;
        for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
          for (local_70 = 0; local_70 < iVar3 + -1; local_70 = local_70 + 1) {
            piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
            *piVar7 = local_60 + local_70;
            local_3c = local_3c + 1;
          }
          local_60 = iVar3 + -1 + local_60;
        }
        for (local_7c = 0; local_7c < (iVar3 + -1) * (iVar3 + -2); local_7c = local_7c + 1) {
          if (local_7c % 2 != 0) {
            piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
            *piVar7 = iVar5 + (iVar3 + -1) * 3 + local_7c;
            local_3c = local_3c + 1;
          }
        }
      }
    }
    else if (MVar4 == EQuadrilateral) {
      (*in_RDX->_vptr_TPZVec[3])(in_RDX,(long)(local_3c + iVar3 * (iVar3 + 2)));
      local_84 = iVar5;
      for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
        for (local_94 = 0; local_94 < iVar3; local_94 = local_94 + 1) {
          piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
          *piVar7 = local_84 + local_94;
          local_3c = local_3c + 1;
        }
        local_84 = iVar3 + local_84;
      }
      iVar5 = iVar5 + iVar3 * 4;
      iVar6 = (iVar3 + -1) * 2 * (iVar3 + -1);
      for (local_a4 = 0; local_a4 < iVar6; local_a4 = local_a4 + 1) {
        if (local_a4 % 2 != 0) {
          piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
          *piVar7 = iVar5 + local_a4;
          local_3c = local_3c + 1;
        }
      }
      for (local_a8 = 0; local_a8 < iVar3 + -1; local_a8 = local_a8 + 1) {
        piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
        *piVar7 = iVar5 + iVar6 + iVar3 + -1 + local_a8;
        local_3c = local_3c + 1;
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "static void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter(const TPZVec<int> &, const TPZVec<int> &, TPZVec<int> &) [TSHAPE = pzshape::TPZShapeCube]"
                              );
      poVar8 = std::operator<<(poVar8," error. Not yet implemented");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      pzinternal::DebugStopImpl(in_stack_00000310,in_stack_00000308);
    }
  }
  piVar7 = TPZVec<int>::operator[](in_RSI,(long)(iVar2 + iVar1));
  iVar5 = *piVar7;
  piVar7 = TPZVec<int>::operator[](in_RDI,(long)(iVar2 + iVar1));
  iVar1 = *piVar7;
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,(long)(local_3c + iVar5 * iVar5 * (iVar5 * 2 + 3)));
  iVar2 = iVar5 * 6 * iVar5;
  for (local_c8 = iVar5 * iVar5; local_c8 < iVar2; local_c8 = local_c8 + 1) {
    piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
    *piVar7 = iVar1 + local_c8;
    local_3c = local_3c + 1;
  }
  iVar1 = iVar1 + iVar2;
  iVar2 = (iVar5 + -1) * 3 * (iVar5 + -1) * (iVar5 + -1);
  iVar5 = (iVar5 + -1) * (iVar5 * 2 + -1);
  for (local_d8 = 0; local_d8 < iVar2; local_d8 = local_d8 + 1) {
    if (local_d8 % 3 != 2) {
      piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
      *piVar7 = iVar1 + local_d8;
      local_3c = local_3c + 1;
    }
  }
  iVar1 = iVar1 + iVar2;
  for (local_e0 = 0; local_e0 < iVar5; local_e0 = local_e0 + 1) {
    piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
    *piVar7 = iVar1 + local_e0;
    local_3c = local_3c + 1;
  }
  for (local_e8 = 0; local_e8 < iVar5; local_e8 = local_e8 + 1) {
    piVar7 = TPZVec<int>::operator[](in_RDX,(long)local_3c);
    *piVar7 = iVar1 + iVar5 + local_e8;
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::HighOrderFunctionsFilter(
  const TPZVec<int> &firstHCurlFunc,
  const TPZVec<int> &conOrders,
  TPZVec<int> &filteredFuncs){
  
  constexpr auto dim = TSHAPE::Dimension;
  constexpr auto nNodes = TSHAPE::NCornerNodes;
  constexpr auto nConnects = TSHAPE::NSides - nNodes;
  const auto nFaces = TSHAPE::NumSides(2);
  const auto nEdges = TSHAPE::NumSides(1);

  filteredFuncs.Resize(0);
  /*
    face connects: 
  */
  auto fcount = 0;
  for(auto iface = 0; iface < nFaces; iface++){
    const auto icon = nEdges + iface;
    const auto side = icon + nNodes;
    const auto firstSideShape = firstHCurlFunc[icon];
    const auto order = conOrders[icon];

    switch(TSHAPE::Type(side)){
    case ETriangle:{
      //there are no face functions for k < 2
      if(order < 2) break;
      /**
         we remove one internal function for each h1 face function of order k+1
         since there are (k-1)(k-2)/2 functions per face in a face with order k,
         we remove k(k-1)/2.
         so:
         (k-1)*(k+1)-k*(k-1)/2 = (k-1)(k+2)/2.
      */
      const auto nfacefuncs =  (order - 1) * (order+2) / 2;
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 3(k-1) vfe funcs.
         that means that, at each k, there are 3 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{3};
      for (auto ie = 0; ie < nedges - 1; ie++){
        const int nfuncs = order-1;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /**
         there are already 2(k-1) filtered functions. we discarded (k-1).
         so that means we need more (k-1)(k-2)/2 functions, because
         2(k-1) + (k-1)(k-2)/2 = (k-1)(k+2)/2. 
         That means we can take exactly half of the phi_fi functions. 
         for each k, there are 2(k-2) phi_fi func. so...
      **/
      auto firstVfiK = firstSideShape + 3*(order-1);
      const auto nPhiFi = (order-1)*(order-2);
      for(auto ifunc = 0; ifunc < nPhiFi; ifunc++){
        if(ifunc%2 == 0) continue;//we always skip one of them
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      break;
    }
    case EQuadrilateral:{
      /*
        from the 2k(k+1) functions, we filter out k^2 gradients of h1, thus
        there are k(k+2) remaining functions.
        from the 2k(k-1) phi_Fi functions, we can remove half of them,
        that sums k(k-1). so, we remove aditionally k phi_Fe functions of a given edge.
        k(k-1) + 3k = k(k+2) as we wanted.

        we need to take into account x- and y -dirs
      */
      const auto nfacefuncs =  order * (order+2);
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 4k vfe funcs.
         that means that, at each k, there are 4 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge, which
         is associated with the x direction
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{4};
      for (auto ie = 0; ie < nedges-1; ie++){
        const int nfuncs = order;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /*now we take half of the phi_fi functions.
        there are 2(k-1)(k-1) scalar functions that will be multiplied by
        vectors in both the x and y directions. we will skip all in the x dir.
        and then, 2*(k-1) functions that will be half in x dir and half in y dir.
        we also skip all in the x dir
       */
      auto firstVfiK = firstSideShape + 4*order;
      const auto nPhiFiK = 2*(order-1)*(order-1);
      const auto nPhiFiK1 = (order-1); // we will have nPhiFiK1 in x and nPhiFiK1 in y
      for(auto ifunc = 0; ifunc < nPhiFiK; ifunc++){
        if(ifunc%2==0) continue;//we always skip the one in x dir
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      //taking only the ones in the y-dir
      for(auto ifunc = 0; ifunc < nPhiFiK1; ifunc++){
        filteredFuncs[fcount] = firstVfiK+nPhiFiK+nPhiFiK1+ifunc;
        fcount++;
      }
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      break;
    }
    default:
      PZError<<__PRETTY_FUNCTION__<<" error. Not yet implemented"<<std::endl;
      DebugStop();
    }

  }
  
  if constexpr (dim < 3) return;

  if constexpr (TSHAPE::Type() == ETetraedro){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)(k-2)(k-3)/6 functions in a h1 element with order k,
       we remove k(k-1)(k-2)/6.
       so:
       (k-1)(k-2)(k+1)/2 - k(k-1)(k-2)/6 = (k-1)(k-2)(2k+3)/6.

       since we will remove k(k-1)(k-2)/6, for each  k   we remove (k-1)(k-2)/2 funcs.

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   k-1                 new funcs
       phi_kf      2(k-1)(k-2)         2(k-2)(k-3)         4(k-2)
       phi_ki      (k-1)(k-2)(k-3)/2   (k-2)(k-3)(k-4)/2   3(k-2)(k-3)/2
            
       that means that if we remove, for each k, (k-2) phi_kf 
       (for instance, all phi_kf associated with a given face),
       we need to remove (k-1)(k-2)/2 - (k-2) = (k-2)(k-3)/2
       which is exactly one third of the phi_ki.
            
    */

    const auto nintfuncs =  (order - 1) * (order-2) * (2*order+ 3) / 6;

    filteredFuncs.Resize(fcount+nintfuncs);

    /**
       we will iterate over the phi_kf hcurl functions.
       we chose to remove all the functions for a given face
       since they are sorted by face, we can simply skip (k-1)(k-2)/2 functions...
    */
    const auto firstvkf = firstSideShape;
    const auto offset = (order-1)*(order-2)/2;
    const auto nvkf = 2*(order-1)*(order-2);
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions
    */

    auto firstVki = firstSideShape + nvkf;
    for(auto ik = 4; ik <= order; ik++){
      //we chose to remove all the functions for a given direction
      const auto newvki = 3*(ik-2)*(ik-3)/2;
      for(auto ifunc = 0; ifunc < newvki; ifunc++){
        if(ifunc%3 == 0) continue;
        filteredFuncs[fcount] = firstVki+ifunc;
        fcount++;
      }
      //we skip to the higher order ones
      firstVki += newvki;
    }
  }
  else if constexpr (TSHAPE::Type() == ECube){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)^3 functions in a h1 element with order k,
       we remove k^3
       so:
       3k^2(k+1) - k^3 = k^2(2k+3)

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   
       phi_kf      6k^2
       phi_ki      3k^2(k-1)

       if we remove all phi_kf associated with a given face (k^2 funcs)
       and all phi_ki associated with a given direction (k^2(k-1)),
       we have removed all k^3 functions that we needed to.
    */

    const auto nintfuncs =  order*order*(2*order+3);

    filteredFuncs.Resize(fcount+nintfuncs);


    const auto firstvkf = firstSideShape;
    
    const auto offset = order*order;//we skip the first face, z direction
    const auto nvkf = 6*order*order;
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions. we have them separated:
       3(k-1)^3 functions of order k and 3(k-1)(2k-1) ( (k-1)(2k-1) in each direction).
       we will filter all funcs in z direction
    */

    const auto firstVki = firstSideShape + nvkf;
    const auto nvkik = 3*(order-1)*(order-1)*(order-1);
    const auto nvkik1 = (order-1)*(2*order-1);//for each direction
    
    for(auto ifunc = 0; ifunc < nvkik; ifunc++){
      if(ifunc%3 == 2) continue;//skip z direction
      filteredFuncs[fcount] = firstVki+ifunc;
      fcount++;
    }

    const auto firstxfunc = firstVki+nvkik;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//x dir
      filteredFuncs[fcount] = firstxfunc+ifunc;
      fcount++;
    }
    const auto firstyfunc = firstxfunc+nvkik1;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//y dir
      filteredFuncs[fcount] = firstyfunc+ifunc;
      fcount++;
    }
  }
}